

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inmemorybenchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *pvVar3;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX;
  ostream *poVar4;
  shared_ptr<FastPForLib::IntegerCODEC> *psVar5;
  bool bVar6;
  int __oflag;
  pointer pbVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  string *this;
  ulong uVar11;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  int option_index;
  bool local_324;
  bool local_323;
  allocator local_321;
  uint local_320;
  int local_31c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codecslst;
  size_t MAXCOUNTER;
  string filename;
  size_t MAXLENGTH;
  size_t MINLENGTH;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> myalgos;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> rawdata;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  tmp;
  string local_260;
  CODECFactory factory;
  string local_210;
  string local_1f0;
  string local_1d0;
  MaropuGapReader reader;
  undefined1 auVar12 [16];
  
  local_31c = argc;
  if (argc < 2) {
    message(*argv);
    return -1;
  }
  FastPForLib::CODECFactory::CODECFactory(&factory);
  pvVar3 = FastPForLib::CODECFactory::allSchemes(&tmp,&factory);
  myalgos.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myalgos.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  myalgos.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; tmp.
         super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         tmp.
         super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      tmp.
      super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           tmp.
           super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    FastPForLib::algostats::algostats
              ((algostats *)&reader,
               tmp.
               super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
               ._M_impl.super__Vector_impl_data._M_start,false);
    std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
    emplace_back<FastPForLib::algostats>(&myalgos,(algostats *)&reader);
    FastPForLib::algostats::~algostats((algostats *)&reader);
    FastPForLib::algostats::algostats
              ((algostats *)&reader,
               tmp.
               super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
               ._M_impl.super__Vector_impl_data._M_start,true);
    std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
    emplace_back<FastPForLib::algostats>(&myalgos,(algostats *)&reader);
    FastPForLib::algostats::~algostats((algostats *)&reader);
    pvVar3 = extraout_RAX;
  }
  bVar6 = false;
  local_320 = (uint)CONCAT71((int7)((ulong)pvVar3 >> 8),1);
LAB_00107955:
  while( true ) {
    while( true ) {
      while( true ) {
        option_index = 0;
        iVar2 = getopt_long(local_31c,argv,"DSc:n:m:M:",long_options,&option_index);
        if (iVar2 != 0x44) break;
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "# Outputting separate delta and inverseDelta times.");
        bVar6 = true;
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if (iVar2 == 0x4d) {
        std::__cxx11::string::string((string *)&filename,_optarg,(allocator *)&rawdata);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&reader,(string *)&filename,_S_in);
        std::istream::_M_extract<unsigned_long>((ulong *)&reader);
        std::__cxx11::istringstream::~istringstream((istringstream *)&reader);
        std::__cxx11::string::~string((string *)&filename);
        poVar4 = std::operator<<((ostream *)&std::cout,"# MAXLENGTH = ");
        goto LAB_00107cbc;
      }
      if (iVar2 != 0x53) break;
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "#\n# disabling partition of big arrays. Performance may suffer.\n#")
      ;
      std::endl<char,std::char_traits<char>>(poVar4);
      local_320 = 0;
    }
    if (iVar2 != 99) break;
    std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::clear(&myalgos);
    std::__cxx11::string::string((string *)&filename,_optarg,(allocator *)&reader);
    iVar2 = std::__cxx11::string::compare((char *)&filename);
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&reader,",:;",(allocator *)&rawdata);
      FastPForLib::split(&codecslst,&filename,(string *)&reader);
      std::__cxx11::string::~string((string *)&reader);
      for (pbVar7 = codecslst.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != codecslst.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"# pretty name = ");
        poVar4 = std::operator<<(poVar4,(string *)pbVar7);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar10 = (char *)std::__cxx11::string::at((ulong)pbVar7);
        if (*pcVar10 == '@') {
          std::__cxx11::string::substr((ulong)&rawdata,(ulong)pbVar7);
          std::__cxx11::string::string((string *)&local_210,(string *)&rawdata);
          psVar5 = FastPForLib::CODECFactory::getFromName(&factory,&local_210);
          FastPForLib::algostats::algostats((algostats *)&reader,psVar5,true);
          std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
          emplace_back<FastPForLib::algostats>(&myalgos,(algostats *)&reader);
          FastPForLib::algostats::~algostats((algostats *)&reader);
          std::__cxx11::string::~string((string *)&local_210);
          this = (string *)&rawdata;
        }
        else {
          std::__cxx11::string::string((string *)&local_1d0,(string *)pbVar7);
          psVar5 = FastPForLib::CODECFactory::getFromName(&factory,&local_1d0);
          FastPForLib::algostats::algostats((algostats *)&reader,psVar5,false);
          std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
          emplace_back<FastPForLib::algostats>(&myalgos,(algostats *)&reader);
          FastPForLib::algostats::~algostats((algostats *)&reader);
          this = &local_1d0;
        }
        std::__cxx11::string::~string((string *)this);
        poVar4 = std::operator<<((ostream *)&std::cout,"# added \'");
        FastPForLib::algostats::name_abi_cxx11_
                  ((string *)&reader,
                   myalgos.
                   super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        poVar4 = std::operator<<(poVar4,(string *)&reader);
        poVar4 = std::operator<<(poVar4,"\'");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&reader);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&codecslst);
    }
    std::__cxx11::string::~string((string *)&filename);
  }
  if (iVar2 == 0x6d) {
    std::__cxx11::string::string((string *)&filename,_optarg,(allocator *)&rawdata);
    std::__cxx11::istringstream::istringstream((istringstream *)&reader,(string *)&filename,_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)&reader);
    std::__cxx11::istringstream::~istringstream((istringstream *)&reader);
    std::__cxx11::string::~string((string *)&filename);
    poVar4 = std::operator<<((ostream *)&std::cout,"# MINLENGTH = ");
LAB_00107cbc:
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  else {
    if (iVar2 == 0x6e) {
      std::__cxx11::string::string((string *)&filename,_optarg,(allocator *)&rawdata);
      std::__cxx11::istringstream::istringstream((istringstream *)&reader,(string *)&filename,_S_in)
      ;
      std::istream::_M_extract<unsigned_long>((ulong *)&reader);
      std::__cxx11::istringstream::~istringstream((istringstream *)&reader);
      std::__cxx11::string::~string((string *)&filename);
      poVar4 = std::operator<<((ostream *)&std::cout,"# MAXCOUNTER = ");
      goto LAB_00107cbc;
    }
    if (iVar2 == -1) goto LAB_00107d10;
    poVar4 = std::operator<<((ostream *)&std::cerr,"unrecognized flag");
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  goto LAB_00107955;
LAB_00107d10:
  if (_optind < local_31c) {
    std::__cxx11::string::string((string *)&filename,argv[_optind],(allocator *)&reader);
    auVar12._8_8_ = extraout_XMM1_Qb;
    auVar12._0_8_ = extraout_XMM1_Qa;
    poVar4 = std::operator<<((ostream *)&std::cout,"# parsing ");
    poVar4 = std::operator<<(poVar4,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar10 = (char *)&filename;
    FastPForLib::MaropuGapReader::MaropuGapReader(&reader,(string *)pcVar10);
    rawdata.super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rawdata.super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rawdata.super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    FastPForLib::MaropuGapReader::open(&reader,pcVar10,__oflag);
    uVar11 = 0;
    do {
      iVar2 = (int)pcVar10;
      if (0xfffffffffffffffe < uVar11) break;
      codecslst.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      codecslst.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      codecslst.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      poVar4 = std::operator<<((ostream *)&std::cout,"# Filling up a block ");
      std::endl<char,std::char_traits<char>>(poVar4);
      uVar9 = 0;
      do {
        do {
          pcVar10 = (char *)&rawdata;
          bVar1 = FastPForLib::MaropuGapReader::
                  loadIntegers<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                            (&reader,&rawdata);
          if (!bVar1) {
LAB_00107e61:
            if (uVar9 == 0) {
              bVar1 = false;
              goto LAB_00107f6b;
            }
            goto LAB_00107e6a;
          }
          uVar8 = (long)rawdata.
                        super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)rawdata.
                        super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2;
        } while ((uVar8 == 0) || (0xffffffff < uVar8));
        std::
        vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
        ::push_back((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                     *)&codecslst,(value_type *)&rawdata);
        uVar11 = uVar11 + 1;
        uVar9 = uVar9 + uVar8;
        if (0xfffffffffffffffe < uVar11) {
          pcVar10 = "#breaking early";
          poVar4 = std::operator<<((ostream *)&std::cout,"#breaking early");
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_00107e61;
        }
      } while (uVar9 < 0x6400000);
LAB_00107e6a:
      poVar4 = std::operator<<((ostream *)&std::cout,"# read ");
      auVar12 = vcvtusi2sd_avx512f(auVar12,uVar9);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 3;
      poVar4 = std::ostream::_M_insert<double>(auVar12._0_8_ * 4.0 * 9.5367431640625e-07);
      poVar4 = std::operator<<(poVar4," MB, ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," arrays.");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"# processing block");
      std::endl<char,std::char_traits<char>>(poVar4);
      if ((local_320 & 1) != 0) {
        FastPForLib::
        splitLongArrays<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                  ((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                    *)&codecslst,0x10000);
      }
      option_index = 1;
      local_324 = true;
      local_323 = bVar6;
      std::__cxx11::string::string((string *)&local_1f0,"",&local_321);
      pcVar10 = (char *)&codecslst;
      FastPForLib::Delta::
      process<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                (&myalgos,(vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                           *)pcVar10,(processparameters *)&option_index,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      auVar12._8_8_ = extraout_XMM1_Qb_00;
      auVar12._0_8_ = extraout_XMM1_Qa_00;
      bVar1 = true;
LAB_00107f6b:
      std::
      vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                 *)&codecslst);
      iVar2 = (int)pcVar10;
    } while (bVar1);
    FastPForLib::MaropuGapReader::close(&reader,iVar2);
    poVar4 = std::operator<<((ostream *)&std::cout,"# build summary...");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_260,"#",(allocator *)&codecslst);
    FastPForLib::summarize(&myalgos,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::_Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
    ~_Vector_base(&rawdata.
                   super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                 );
    FastPForLib::MaropuGapReader::~MaropuGapReader(&reader);
    std::__cxx11::string::~string((string *)&filename);
    iVar2 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"  you must specify a file ");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = -1;
  }
  std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::~vector(&myalgos);
  std::
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  ::~vector(&tmp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
               *)&factory);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    message(argv[0]);
    return -1;
  }
  bool splitlongarrays = true;
  bool separatedeltatimes = false;
  size_t MINLENGTH = 1;
  size_t MAXLENGTH = (std::numeric_limits<uint32_t>::max)();
  size_t MAXCOUNTER = (std::numeric_limits<std::size_t>::max)();
  CODECFactory factory;
  vector<shared_ptr<IntegerCODEC>> tmp =
      factory.allSchemes(); // the default
  vector<algostats> myalgos;
  for (auto i = tmp.begin(); i != tmp.end(); ++i) {
    myalgos.push_back(algostats(*i));
    myalgos.push_back(algostats(*i, true)); // by default?
  }
  int c;
  while (1) {
    int option_index = 0;
    c = getopt_long(argc, argv, "DSc:n:m:M:", long_options, &option_index);
    if (c == -1)
      break;
    switch (c) {
    case 'D':
      cout << "# Outputting separate delta and inverseDelta times." << endl;
      separatedeltatimes = true;
      break;
    case 'S':
      cout << "#\n# disabling partition of big arrays. Performance may "
              "suffer.\n#"
           << endl;
      splitlongarrays = false;
      break;
    case 'm':
      istringstream(optarg) >> MINLENGTH;
      cout << "# MINLENGTH = " << MINLENGTH << endl;
      break;
    case 'M':
      istringstream(optarg) >> MAXLENGTH;
      cout << "# MAXLENGTH = " << MAXLENGTH << endl;
      break;
    case 'n':
      istringstream(optarg) >> MAXCOUNTER;
      cout << "# MAXCOUNTER = " << MAXCOUNTER << endl;
      break;
    case 'c': {
      myalgos.clear();
      string codecsstr(optarg);
      if (codecsstr.compare("NONE") != 0) {
        vector<string> codecslst = split(codecsstr, ",:;");
        for (auto i = codecslst.begin(); i != codecslst.end(); ++i) {
          cout << "# pretty name = " << *i << endl;
          if (i->at(0) == '@') { // SIMD
            string namewithoutprefix = i->substr(1, i->size() - 1);
            myalgos.push_back(
                algostats(factory.getFromName(namewithoutprefix), true));
          } else {
            myalgos.push_back(algostats(factory.getFromName(*i)));
          }
          cout << "# added '" << myalgos.back().name() << "'" << endl;
        }
      }
    } break;
    default:
      cerr << "unrecognized flag" << endl;
      break;
    }
  }

  if (argc - optind < 1) {
    cerr << "  you must specify a file " << endl;
    return -1;
  }
  string filename = argv[optind];

  cout << "# parsing " << filename << endl;
  MaropuGapReader reader(filename);

  vector<uint32_t, cacheallocator> rawdata;
  reader.open();
  size_t counter = 0;
  const size_t MAXBLOCKSIZE = 104857600; // 400 MB
  while (counter < MAXCOUNTER) {
    // collecting the data up to MAXBLOCKSIZE integers
    vector<vector<uint32_t, cacheallocator>> datas;
    size_t datastotalsize = 0;
    cout << "# Filling up a block " << endl;
    while (reader.loadIntegers(rawdata)) {
      if ((rawdata.size() < MINLENGTH) || (rawdata.size() > MAXLENGTH))
        continue;
      ++counter;
      datastotalsize += rawdata.size();
      datas.push_back(rawdata);
      if (counter >= MAXCOUNTER) {
        cout << "#breaking early" << endl;
        break;
      }
      if (datastotalsize >= MAXBLOCKSIZE)
        break;
    }
    if (datastotalsize == 0)
      break;
    cout << "# read " << std::setprecision(3)
         << static_cast<double>(datastotalsize) * 4.0 / (1024.0 * 1024.0)
         << " MB, " << datas.size() << " arrays." << endl;

    cout << "# processing block" << endl;
    if (splitlongarrays)
      splitLongArrays(datas);
    processparameters pp(true, false, false, false, true, separatedeltatimes);
    Delta::process(myalgos, datas,
                   pp); // done collecting data, now allocating memory
  }
  reader.close();
  cout << "# build summary..." << endl;
  summarize(myalgos);
}